

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hpp
# Opt level: O1

bool __thiscall
boost::pool<boost::default_user_allocator_new_delete>::purge_memory
          (pool<boost::default_user_allocator_new_delete> *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  
  pcVar1 = (this->list).ptr;
  if (pcVar1 != (char *)0x0) {
    sVar4 = (this->list).sz;
    pcVar3 = pcVar1;
    do {
      pcVar2 = *(char **)(pcVar3 + (sVar4 - 0x10));
      sVar4 = *(size_type *)(pcVar3 + (sVar4 - 8));
      operator_delete__(pcVar3);
      pcVar3 = pcVar2;
    } while (pcVar2 != (char *)0x0);
    (this->super_simple_segregated_storage<unsigned_long>).first = (void *)0x0;
    (this->list).ptr = (char *)0x0;
    this->next_size = this->start_size;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool pool<UserAllocator>::purge_memory()
{ //! pool must be ordered.
  //! Frees every memory block.
  //!
  //! This function invalidates any pointers previously returned
  //! by allocation functions of t.
  //! \returns true if at least one memory block was freed.

  details::PODptr<size_type> iter = list;

  if (!iter.valid())
    return false;

  do
  {
    // hold "next" pointer
    const details::PODptr<size_type> next = iter.next();

    // delete the storage
    (UserAllocator::free)(iter.begin());

    // increment iter
    iter = next;
  } while (iter.valid());

  list.invalidate();
  this->first = 0;
  next_size = start_size;

  return true;
}